

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxautopr.hpp
# Opt level: O0

bool __thiscall
soplex::
SPxAutoPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::setActivePricer(SPxAutoPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *this,Type type)

{
  int iVar1;
  undefined4 in_ESI;
  long in_RDI;
  
  if ((*(long *)(in_RDI + 0x70) == in_RDI + 0x78) &&
     (iVar1 = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::iterations((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            *)0x3a87f2), *(int *)(in_RDI + 0x68) <= iVar1)) {
    *(long *)(in_RDI + 0x70) = in_RDI + 400;
    (**(code **)(**(long **)(in_RDI + 0x70) + 0x38))(*(long **)(in_RDI + 0x70),in_ESI);
    return true;
  }
  if ((*(long *)(in_RDI + 0x70) == in_RDI + 400) &&
     (iVar1 = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::iterations((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            *)0x3a8847), iVar1 < *(int *)(in_RDI + 0x68))) {
    *(long *)(in_RDI + 0x70) = in_RDI + 0x78;
    (**(code **)(**(long **)(in_RDI + 0x70) + 0x38))(*(long **)(in_RDI + 0x70),in_ESI);
    return true;
  }
  return false;
}

Assistant:

bool SPxAutoPR<R>::setActivePricer(typename SPxSolverBase<R>::Type type)
{
   // switch to steep as soon as switchIters is reached
   if(activepricer == &devex && this->thesolver->iterations() >= switchIters)
   {
      activepricer = &steep;
      activepricer->setType(type);
      return true;
   }


   // use devex for the iterations < switchIters
   else if(activepricer == &steep && this->thesolver->iterations() < switchIters)
   {
      activepricer = &devex;
      activepricer->setType(type);
      return true;
   }

   return false;
}